

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

int av1_write_uleb_obu_size(size_t obu_payload_size,uint8_t *dest,size_t dest_size)

{
  int iVar1;
  size_t coded_obu_size;
  size_t local_18;
  
  local_18 = 0;
  iVar1 = aom_uleb_encode(obu_payload_size,dest_size,dest,&local_18);
  return (int)(local_18 != dest_size || iVar1 != 0);
}

Assistant:

int av1_write_uleb_obu_size(size_t obu_payload_size, uint8_t *dest,
                            size_t dest_size) {
  size_t coded_obu_size = 0;

  if (aom_uleb_encode(obu_payload_size, dest_size, dest, &coded_obu_size) !=
      0) {
    return AOM_CODEC_ERROR;
  }
  if (coded_obu_size != dest_size) {
    return AOM_CODEC_ERROR;
  }

  return AOM_CODEC_OK;
}